

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkResize(ARKodeMem ark_mem,N_Vector y0,realtype hscale,realtype t0,ARKVecResizeFn resize,
             void *resize_data)

{
  int iVar1;
  int lrw_diff_00;
  int iVar2;
  uint uVar3;
  ARKodeMem in_RCX;
  N_Vector in_RSI;
  ARKodeMem in_RDI;
  N_Vector in_XMM0_Qa;
  realtype in_XMM1_Qa;
  int retval;
  sunindextype liw_diff;
  sunindextype lrw_diff;
  sunindextype liw1;
  sunindextype lrw1;
  int resizeOK;
  N_Vector in_stack_ffffffffffffffa8;
  sunindextype in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar4;
  int iVar5;
  undefined4 in_stack_ffffffffffffffc4;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkResize","arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->MallocDone == 0) {
    arkProcessError(in_RDI,-0x17,"ARKode","arkResize","Attempt to call before ARKodeInit.");
    local_4 = -0x17;
  }
  else if (in_RSI == (N_Vector)0x0) {
    arkProcessError(in_RDI,-0x16,"ARKode","arkResize","y0 = NULL illegal.");
    local_4 = -0x16;
  }
  else {
    in_RDI->tcur = in_XMM1_Qa;
    in_RDI->tn = in_XMM1_Qa;
    if ((double)in_XMM0_Qa < 0.0) {
      in_XMM0_Qa = (N_Vector)&DAT_3ff0000000000000;
    }
    if (((double)in_XMM0_Qa != 1.0) || (NAN((double)in_XMM0_Qa))) {
      in_RDI->eta = (realtype)in_XMM0_Qa;
      in_RDI->hprime = (double)in_XMM0_Qa * in_RDI->hprime;
      if ((in_RDI->tstopset != 0) &&
         (0.0 < ((in_RDI->tcur + in_RDI->hprime) - in_RDI->tstop) * in_RDI->hprime)) {
        in_RDI->hprime = (in_RDI->tstop - in_RDI->tcur) * (in_RDI->uround * -4.0 + 1.0);
        in_RDI->eta = in_RDI->hprime / in_RDI->h;
      }
    }
    iVar4 = 0;
    iVar5 = 0;
    if (in_RSI->ops->nvspace != (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
      N_VSpace((N_Vector)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (sunindextype *)in_stack_ffffffffffffffa8,(sunindextype *)0xebeb2d);
    }
    iVar1 = iVar5 - in_RDI->lrw1;
    lrw_diff_00 = iVar4 - in_RDI->liw1;
    in_RDI->lrw1 = iVar5;
    in_RDI->liw1 = iVar4;
    iVar2 = arkResizeVectors(in_RCX,(ARKVecResizeFn)CONCAT44(in_stack_ffffffffffffffc4,iVar5),
                             (void *)CONCAT44(iVar4,iVar1),lrw_diff_00,in_stack_ffffffffffffffb0,
                             in_stack_ffffffffffffffa8);
    if (iVar2 == 0) {
      arkProcessError(in_RDI,-0x14,"ARKode","arkResize","Unable to resize vector");
      local_4 = -0x14;
    }
    else {
      if (in_RDI->interp != (ARKInterp)0x0) {
        uVar3 = arkInterpResize(in_RCX,(ARKInterp)CONCAT44(iVar2,iVar5),
                                (ARKVecResizeFn)CONCAT44(iVar4,iVar1),
                                (void *)CONCAT44(lrw_diff_00,in_stack_ffffffffffffffb0),
                                (sunindextype)((ulong)in_RSI >> 0x20),(sunindextype)in_RSI,
                                in_XMM0_Qa);
        if (uVar3 != 0) {
          arkProcessError(in_RDI,(int)(ulong)uVar3,"ARKode","arkResize",
                          "Interpolation module resize failure");
          return uVar3;
        }
        in_stack_ffffffffffffffb0 = 0;
        in_stack_ffffffffffffffa8 = in_RSI;
      }
      N_VScale((realtype)CONCAT44(lrw_diff_00,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8,
               (N_Vector)0xebec6d);
      in_RDI->constraintsSet = 0;
      in_RDI->initsetup = 1;
      in_RDI->init_type = 2;
      in_RDI->firststage = 1;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int arkResize(ARKodeMem ark_mem, N_Vector y0, realtype hscale,
              realtype t0, ARKVecResizeFn resize, void *resize_data)
{
  booleantype resizeOK;
  sunindextype lrw1, liw1, lrw_diff, liw_diff;
  int retval;

  /* Check ark_mem */
  if (ark_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkResize", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE) {
    arkProcessError(ark_mem, ARK_NO_MALLOC, "ARKode",
                    "arkResize", MSG_ARK_NO_MALLOC);
    return(ARK_NO_MALLOC);
  }

  /* Check for legal input parameters */
  if (y0 == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkResize", MSG_ARK_NULL_Y0);
    return(ARK_ILL_INPUT);
  }

  /* Copy the input parameters into ARKode state */
  ark_mem->tcur = t0;
  ark_mem->tn   = t0;

  /* Update time-stepping parameters */
  /*   adjust upcoming step size depending on hscale */
  if (hscale < ZERO)  hscale = ONE;
  if (hscale != ONE) {

    /* Encode hscale into ark_mem structure */
    ark_mem->eta = hscale;
    ark_mem->hprime *= hscale;

    /* If next step would overtake tstop, adjust stepsize */
    if ( ark_mem->tstopset )
      if ( (ark_mem->tcur + ark_mem->hprime - ark_mem->tstop)*ark_mem->hprime > ZERO ) {
        ark_mem->hprime = (ark_mem->tstop-ark_mem->tcur) *
          (ONE-FOUR*ark_mem->uround);
        ark_mem->eta = ark_mem->hprime/ark_mem->h;
      }

  }

  /* Determing change in vector sizes */
  lrw1 = liw1 = 0;
  if (y0->ops->nvspace != NULL)
    N_VSpace(y0, &lrw1, &liw1);
  lrw_diff = lrw1 - ark_mem->lrw1;
  liw_diff = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;

  /* Resize the solver vectors (using y0 as a template) */
  resizeOK = arkResizeVectors(ark_mem, resize, resize_data,
                              lrw_diff, liw_diff, y0);
  if (!resizeOK) {
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                    "arkResize", "Unable to resize vector");
    return(ARK_MEM_FAIL);
  }

  /* Resize the interpolation structure memory */
  if (ark_mem->interp != NULL) {
    retval = arkInterpResize(ark_mem, ark_mem->interp, resize,
                             resize_data, lrw_diff, liw_diff, y0);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, retval, "ARKode", "arkResize",
                      "Interpolation module resize failure");
      return(retval);
    }
  }

  /* Copy y0 into ark_yn to set the current solution */
  N_VScale(ONE, y0, ark_mem->yn);

  /* Disable constraints */
  ark_mem->constraintsSet = SUNFALSE;

  /* Indicate that problem needs to be initialized */
  ark_mem->initsetup  = SUNTRUE;
  ark_mem->init_type  = RESIZE_INIT;
  ark_mem->firststage = SUNTRUE;

  /* Problem has been successfully re-sized */
  return(ARK_SUCCESS);
}